

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

ExprP<tcu::Matrix<float,_3,_3>_> __thiscall
vkt::shaderexecutor::exprP<tcu::Matrix<float,3,3>>
          (shaderexecutor *this,Expr<tcu::Matrix<float,_3,_3>_> *ptr)

{
  long *plVar1;
  long *plVar2;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *pSVar3;
  ExprP<tcu::Matrix<float,_3,_3>_> *ret;
  int *piVar4;
  ExprP<tcu::Matrix<float,_3,_3>_> EVar5;
  
  plVar2 = (long *)operator_new(0x20);
  *(undefined4 *)(plVar2 + 1) = 0;
  *(undefined4 *)((long)plVar2 + 0xc) = 0;
  *plVar2 = (long)&PTR__SharedPtrState_00d43230;
  plVar2[2] = (long)ptr;
  *(undefined4 *)(plVar2 + 1) = 1;
  *(undefined4 *)((long)plVar2 + 0xc) = 1;
  *(Expr<tcu::Matrix<float,_3,_3>_> **)this = ptr;
  *(long **)(this + 8) = plVar2;
  LOCK();
  *(int *)(plVar2 + 1) = (int)plVar2[1] + 1;
  UNLOCK();
  LOCK();
  *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
  UNLOCK();
  piVar4 = (int *)((long)plVar2 + 0xc);
  LOCK();
  plVar1 = plVar2 + 1;
  *(int *)plVar1 = (int)*plVar1 + -1;
  UNLOCK();
  pSVar3 = extraout_RDX;
  if ((int)*plVar1 == 0) {
    (**(code **)(*plVar2 + 0x10))(plVar2);
    pSVar3 = extraout_RDX_00;
  }
  LOCK();
  *piVar4 = *piVar4 + -1;
  UNLOCK();
  if (*piVar4 == 0) {
    (**(code **)(*plVar2 + 8))(plVar2);
    pSVar3 = extraout_RDX_01;
  }
  EVar5.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_state = pSVar3;
  EVar5.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_3,_3>_> *)this;
  return (ExprP<tcu::Matrix<float,_3,_3>_>)
         EVar5.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
         super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>;
}

Assistant:

ExprP<T> exprP (const Expr<T>* ptr)
{
	return exprP(SharedPtr<const Expr<T> >(ptr));
}